

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.cpp
# Opt level: O3

BigInteger * __thiscall BigInteger::operator-=(BigInteger *this,BigInteger *a)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  
  this->negative = (bool)(this->negative ^ 1);
  operator+=(this,a);
  this->negative = (bool)(this->negative ^ 1);
  puVar1 = (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (puVar2 == puVar1) {
LAB_001247db:
      this->negative = false;
      return this;
    }
    puVar3 = puVar2 + -1;
    if (*puVar3 != 0) {
      if (puVar2 != puVar1) {
        return this;
      }
      goto LAB_001247db;
    }
    (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
    puVar2 = puVar3;
  } while( true );
}

Assistant:

BigInteger &BigInteger::operator-=(const BigInteger &a) noexcept
{
    negative ^= 1;
    *this += a;
    negative ^= 1;
    normalize();
    return *this;
}